

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O0

void Tim_ManIncrementTravId(Tim_Man_t *p)

{
  int local_14;
  int i;
  Tim_Man_t *p_local;
  
  if (0x3ffffffe < p->nTravIds) {
    p->nTravIds = 0;
    for (local_14 = 0; local_14 < p->nCis; local_14 = local_14 + 1) {
      p->pCis[local_14].TravId = 0;
    }
    for (local_14 = 0; local_14 < p->nCos; local_14 = local_14 + 1) {
      p->pCos[local_14].TravId = 0;
    }
  }
  if (0x3ffffffe < p->nTravIds) {
    __assert_fail("p->nTravIds < (1<<30)-1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timTrav.c"
                  ,0x37,"void Tim_ManIncrementTravId(Tim_Man_t *)");
  }
  p->nTravIds = p->nTravIds + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the trav ID of the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManIncrementTravId( Tim_Man_t * p )
{
    int i;
    if ( p->nTravIds >= (1<<30)-1 )
    {
        p->nTravIds = 0;
        for ( i = 0; i < p->nCis; i++ )
            p->pCis[i].TravId = 0;
        for ( i = 0; i < p->nCos; i++ )
            p->pCos[i].TravId = 0;
    }
    assert( p->nTravIds < (1<<30)-1 );
    p->nTravIds++;
}